

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

idx_t __thiscall duckdb::LocalTableStorage::EstimatedSize(LocalTableStorage *this)

{
  idx_t iVar1;
  pointer pLVar2;
  pointer puVar3;
  int iVar4;
  RowGroupCollection *pRVar5;
  idx_t iVar6;
  vector<duckdb::LogicalType,_true> *pvVar7;
  idx_t iVar8;
  BoundIndex *this_00;
  LogicalType *type;
  pointer pLVar9;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer this_01;
  long lVar10;
  long lVar11;
  
  pRVar5 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  iVar6 = RowGroupCollection::GetTotalRows(pRVar5);
  iVar1 = this->deleted_rows;
  pRVar5 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  pvVar7 = RowGroupCollection::GetTypes(pRVar5);
  pLVar2 = (pvVar7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar10 = 0;
  for (pLVar9 = (pvVar7->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start; pLVar9 != pLVar2; pLVar9 = pLVar9 + 1) {
    iVar8 = GetTypeIdSize(pLVar9->physical_type_);
    lVar10 = lVar10 + iVar8;
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->append_indexes);
  if (iVar4 == 0) {
    puVar3 = (this->append_indexes).indexes.
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar11 = 0;
    for (this_01 = (this->append_indexes).indexes.
                   super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar3;
        this_01 = this_01 + 1) {
      this_00 = (BoundIndex *)
                unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                          (this_01);
      iVar8 = BoundIndex::GetInMemorySize(this_00);
      lVar11 = lVar11 + iVar8;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->append_indexes);
    return lVar10 * (iVar6 - iVar1) + lVar11;
  }
  ::std::__throw_system_error(iVar4);
}

Assistant:

idx_t LocalTableStorage::EstimatedSize() {
	// count the appended rows
	idx_t appended_rows = row_groups->GetTotalRows() - deleted_rows;

	// get the (estimated) size of a row (no compressions, etc.)
	idx_t row_size = 0;
	auto &types = row_groups->GetTypes();
	for (auto &type : types) {
		row_size += GetTypeIdSize(type.InternalType());
	}

	// get the index size
	idx_t index_sizes = 0;
	append_indexes.Scan([&](Index &index) {
		D_ASSERT(index.IsBound());
		index_sizes += index.Cast<BoundIndex>().GetInMemorySize();
		return false;
	});

	// return the size of the appended rows and the index size
	return appended_rows * row_size + index_sizes;
}